

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_packet.cpp
# Opt level: O1

MPP_RET mpp_packet_reset(MppPacketImpl *packet)

{
  void *pvVar1;
  size_t sVar2;
  MPP_RET MVar3;
  MppPacketImpl *p;
  MPP_RET MVar4;
  
  MVar3 = check_is_mpp_packet_f(packet,"mpp_packet_reset");
  MVar4 = MPP_ERR_UNKNOW;
  if (MVar3 == MPP_OK) {
    pvVar1 = packet->data;
    sVar2 = packet->size;
    MVar4 = MPP_OK;
    memset(packet,0,0x148);
    packet->data = pvVar1;
    packet->pos = pvVar1;
    packet->size = sVar2;
    packet->name = "mpp_packet";
    packet->segment_nb = 0;
    packet->segment_buf_cnt = 8;
    memset(packet->segments_def,0,0xc0);
    packet->segments = (MppPktSeg *)0x0;
    if (packet->segments_ext != (MppPktSeg *)0x0) {
      mpp_osal_free("mpp_packet_reset_segment",packet->segments_ext);
    }
    packet->segments_ext = (MppPktSeg *)0x0;
  }
  return MVar4;
}

Assistant:

MPP_RET mpp_packet_reset(MppPacketImpl *packet)
{
    if (check_is_mpp_packet(packet))
        return MPP_ERR_UNKNOW;

    void *data = packet->data;
    size_t size = packet->size;

    memset(packet, 0, sizeof(*packet));

    packet->data = data;
    packet->pos  = data;
    packet->size = size;
    setup_mpp_packet_name(packet);
    mpp_packet_reset_segment(packet);
    return MPP_OK;
}